

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O3

void __thiscall FNotifyBuffer::AddString(FNotifyBuffer *this,int printlevel,FString *source)

{
  int *piVar1;
  FString *this_00;
  char cVar2;
  BYTE *string;
  FNotifyText *pFVar3;
  int iVar4;
  uint uVar5;
  anon_enum_32 aVar6;
  int iVar7;
  FString *other;
  FString str;
  FNotifyText local_50;
  FBrokenLines *local_40;
  FString *local_38;
  
  if ((printlevel != 0x80) && (!show_messages.Value)) {
    return;
  }
  string = (BYTE *)source->Chars;
  if (*(int *)(string + -0xc) == 0) {
    return;
  }
  if ((uint)(gamestate + GS_FORCEWIPEBURN) < 2) {
    return;
  }
  if (con_notifylines.Value == 0) {
    return;
  }
  if (ConsoleDrawing == '\x01') {
    EnqueueConsoleText(true,printlevel,(char *)string);
    return;
  }
  if (con_scaletext.Value == 1) {
    iVar7 = uiscale.Value;
    iVar4 = CleanXfac;
    if (uiscale.Value != 0) goto LAB_00353810;
  }
  else {
    iVar7 = con_scaletext.Value;
    if (con_scaletext.Value != 2) {
      if (con_scaletext.Value == 3) {
        iVar7 = 4;
      }
      else {
        iVar7 = 1;
      }
    }
LAB_00353810:
    iVar4 = iVar7;
  }
  iVar4 = DisplayWidth / iVar4;
  if ((this->AddType == APPENDLINE) && (uVar5 = (this->Text).Count, uVar5 != 0)) {
    uVar5 = uVar5 - 1;
    pFVar3 = (this->Text).Array;
    if (pFVar3[uVar5].PrintLevel == printlevel) {
      FString::operator+((FString *)&local_50,&pFVar3[uVar5].Text);
      local_40 = V_BreakLines(SmallFont,iVar4,(BYTE *)CONCAT44(local_50.PrintLevel,local_50.TimeOut)
                              ,false);
      FString::~FString((FString *)&local_50);
      goto LAB_003538a0;
    }
  }
  local_40 = V_BreakLines(SmallFont,iVar4,string,false);
  if (this->AddType == APPENDLINE) {
    this->AddType = NEWLINE;
  }
LAB_003538a0:
  if (local_40 != (FBrokenLines *)0x0) {
    local_38 = source;
    if (-1 < local_40->Width) {
      this_00 = &local_50.Text;
      other = &local_40->Text;
      do {
        local_50.Text.Chars = FString::NullString.Nothing;
        FString::NullString.RefCount = FString::NullString.RefCount + 1;
        FString::operator=(this_00,other);
        local_50.TimeOut = (int)(con_notifytime.Value * 35.0) + gametic;
        local_50.PrintLevel = printlevel;
        if ((this->AddType == NEWLINE) || (uVar5 = (this->Text).Count, uVar5 == 0)) {
          if ((0 < con_notifylines.Value) &&
             (uVar5 = (this->Text).Count, iVar4 = uVar5 - (con_notifylines.Value - 1U),
             con_notifylines.Value - 1U <= uVar5 && iVar4 != 0)) {
            TArray<FNotifyText,_FNotifyText>::Delete(&this->Text,0,iVar4);
          }
          TArray<FNotifyText,_FNotifyText>::Push(&this->Text,&local_50);
        }
        else {
          pFVar3 = (this->Text).Array + (uVar5 - 1);
          pFVar3->TimeOut = local_50.TimeOut;
          pFVar3->PrintLevel = printlevel;
          FString::operator=(&pFVar3->Text,this_00);
        }
        this->AddType = NEWLINE;
        FString::~FString(this_00);
        piVar1 = (int *)(other + 1);
        other = other + 2;
      } while (-1 < *piVar1);
    }
    V_FreeBrokenLines(local_40);
    cVar2 = local_38->Chars[(ulong)*(uint *)(local_38->Chars + -0xc) - 1];
    aVar6 = REPLACELINE;
    if (cVar2 != '\r') {
      aVar6 = (anon_enum_32)(cVar2 != '\n');
    }
    this->AddType = aVar6;
    this->TopGoal = 0;
  }
  return;
}

Assistant:

void FNotifyBuffer::AddString(int printlevel, FString source)
{
	FBrokenLines *lines;
	int i, width;

	if ((printlevel != 128 && !show_messages) ||
		source.IsEmpty() ||
		gamestate == GS_FULLCONSOLE ||
		gamestate == GS_DEMOSCREEN ||
		con_notifylines == 0)
		return;

	if (ConsoleDrawing)
	{
		EnqueueConsoleText (true, printlevel, source);
		return;
	}

	if (active_con_scaletext() == 0)
	{
		width = DisplayWidth / CleanXfac;
	}
	else
	{
		width = DisplayWidth / active_con_scaletext();
	}

	if (AddType == APPENDLINE && Text.Size() > 0 && Text[Text.Size() - 1].PrintLevel == printlevel)
	{
		FString str = Text[Text.Size() - 1].Text + source;
		lines = V_BreakLines (SmallFont, width, str);
	}
	else
	{
		lines = V_BreakLines (SmallFont, width, source);
		if (AddType == APPENDLINE)
		{
			AddType = NEWLINE;
		}
	}

	if (lines == NULL)
		return;

	for (i = 0; lines[i].Width >= 0; i++)
	{
		FNotifyText newline;

		newline.Text = lines[i].Text;
		newline.TimeOut = gametic + int(con_notifytime * TICRATE);
		newline.PrintLevel = printlevel;
		if (AddType == NEWLINE || Text.Size() == 0)
		{
			if (con_notifylines > 0)
			{
				Shift(con_notifylines - 1);
			}
			Text.Push(newline);
		}
		else
		{
			Text[Text.Size() - 1] = newline;
		}
		AddType = NEWLINE;
	}

	V_FreeBrokenLines (lines);
	lines = NULL;

	switch (source[source.Len()-1])
	{
	case '\r':	AddType = REPLACELINE;	break;
	case '\n':	AddType = NEWLINE;		break;
	default:	AddType = APPENDLINE;	break;
	}

	TopGoal = 0;
}